

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

void __thiscall
GlobOpt::UpdateIntBoundsForNotEqualBranch
          (GlobOpt *this,Value *src1Value,Value *src2Value,int32 src2ConstantValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int32 local_50;
  int32 iStack_4c;
  IntConstantBounds src1ConstantBounds;
  IntConstantBounds local_38;
  
  if (src1Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0xdc,"(src1Value)","src1Value");
    if (!bVar2) goto LAB_004711d6;
    *puVar3 = 0;
  }
  bVar2 = DoPathDependentValues(this);
  if ((bVar2) && ((src2Value == (Value *)0x0 || (src1Value->valueNumber != src2Value->valueNumber)))
     ) {
    if (this->prePassLoop == (Loop *)0x0) {
      bVar2 = DoAggressiveIntTypeSpec(this);
      if (bVar2) {
        bVar2 = DoConstFold(this);
        if (bVar2) {
          local_50 = 0;
          iStack_4c = 0;
          local_38.lowerBound = 0;
          local_38.upperBound = 0;
          bVar2 = ValueInfo::TryGetIntConstantBounds
                            (src1Value->valueInfo,(IntConstantBounds *)&stack0xffffffffffffffb0,true
                            );
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0xe7,
                               "(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true))"
                               ,
                               "src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true)"
                              );
            if (!bVar2) goto LAB_004711d6;
            *puVar3 = 0;
          }
          if (src2Value == (Value *)0x0) {
            IntConstantBounds::IntConstantBounds(&local_38,src2ConstantValue,src2ConstantValue);
          }
          else {
            bVar2 = ValueInfo::TryGetIntConstantBounds(src2Value->valueInfo,&local_38,true);
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                                 ,0xea,
                                 "(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true))"
                                 ,
                                 "src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true)"
                                );
              if (!bVar2) goto LAB_004711d6;
              *puVar3 = 0;
            }
          }
          bVar2 = ValueInfo::IsEqualTo
                            (src1Value,local_50,iStack_4c,src2Value,local_38.lowerBound,
                             local_38.upperBound);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0xf8,
                               "(!ValueInfo::IsEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                               ,
                               "!ValueInfo::IsEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                              );
            if (!bVar2) goto LAB_004711d6;
            *puVar3 = 0;
          }
          bVar2 = ValueInfo::IsNotEqualTo
                            (src1Value,local_50,iStack_4c,src2Value,local_38.lowerBound,
                             local_38.upperBound);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0x100,
                               "(!ValueInfo::IsNotEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                               ,
                               "!ValueInfo::IsNotEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                              );
            if (!bVar2) {
LAB_004711d6:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar3 = 0;
          }
        }
      }
    }
    PathDependentInfo::PathDependentInfo
              ((PathDependentInfo *)&stack0xffffffffffffffb0,NotEqual,src1Value,src2Value,
               src2ConstantValue);
    SetPathDependentInfo(this,true,(PathDependentInfo *)&stack0xffffffffffffffb0);
    PathDependentInfo::PathDependentInfo
              ((PathDependentInfo *)&stack0xffffffffffffffb0,Equal,src1Value,src2Value,
               src2ConstantValue);
    SetPathDependentInfo(this,false,(PathDependentInfo *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void GlobOpt::UpdateIntBoundsForNotEqualBranch(
    Value *const src1Value,
    Value *const src2Value,
    const int32 src2ConstantValue)
{
    Assert(src1Value);

    if(!DoPathDependentValues() || (src2Value && src1Value->GetValueNumber() == src2Value->GetValueNumber()))
    {
        return;
    }

#if DBG
    if(!IsLoopPrePass() && DoAggressiveIntTypeSpec() && DoConstFold())
    {
        IntConstantBounds src1ConstantBounds, src2ConstantBounds;
        AssertVerify(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true));
        if(src2Value)
        {
            AssertVerify(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true));
        }
        else
        {
            src2ConstantBounds = IntConstantBounds(src2ConstantValue, src2ConstantValue);
        }

        Assert(
            !ValueInfo::IsEqualTo(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
        Assert(
            !ValueInfo::IsNotEqualTo(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
    }
#endif

    SetPathDependentInfo(
        true, PathDependentInfo(PathDependentRelationship::NotEqual, src1Value, src2Value, src2ConstantValue));
    SetPathDependentInfo(
        false, PathDependentInfo(PathDependentRelationship::Equal, src1Value, src2Value, src2ConstantValue));
}